

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O1

void __thiscall CTB<UF>::FirstScan(CTB<UF> *this)

{
  int iVar1;
  Mat1i *pMVar2;
  Mat1b *pMVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar2->field_0x10,0,*(long *)&pMVar2->field_0x20 - *(long *)&pMVar2->field_0x18
        );
  *UF::P_ = 0;
  UF::length_ = 1;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar11 = (ulong)*(int *)&pMVar3->field_0x8;
  if (0 < (long)uVar11) {
    iVar1 = *(int *)&pMVar3->field_0xc;
    lVar14 = (long)iVar1;
    uVar15 = 0;
    do {
      if (0 < iVar1) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar21 = **(long **)&pMVar3->field_0x48;
        lVar16 = lVar21 * uVar15 + *(long *)&pMVar3->field_0x10;
        lVar17 = lVar16 - lVar21;
        lVar21 = lVar21 + lVar16;
        lVar19 = **(long **)&pMVar2->field_0x48;
        lVar23 = lVar19 * uVar15 + *(long *)&pMVar2->field_0x10;
        lVar7 = lVar23 - lVar19;
        lVar19 = lVar19 + lVar23;
        uVar20 = uVar15 | 1;
        uVar5 = 0xffffffff;
        lVar13 = 0;
        iVar12 = -1;
        do {
          switch(uVar5) {
          case 1:
            if (*(char *)(lVar16 + lVar13) != '\0') {
              if (uVar15 == 0) {
LAB_001a486d:
                if ((lVar13 == 0 || uVar15 == 0) || (*(char *)(lVar13 + -1 + lVar17) == '\0')) {
                  UF::P_[UF::length_] = UF::length_;
                  uVar6 = UF::length_ + 1;
                  *(uint *)(lVar23 + lVar13 * 4) = UF::length_;
                  UF::length_ = uVar6;
                }
                else {
                  *(undefined4 *)(lVar23 + lVar13 * 4) = *(undefined4 *)(lVar7 + -4 + lVar13 * 4);
                }
                iVar12 = 6;
              }
              else if (*(char *)(lVar17 + lVar13) == '\0') {
                if ((lVar14 <= lVar13 + 1) || (*(char *)(lVar17 + lVar13 + 1) == '\0'))
                goto LAB_001a486d;
                uVar6 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                iVar12 = 5;
                if ((lVar13 != 0) && (*(char *)(lVar13 + -1 + lVar17) != '\0')) {
                  do {
                    uVar10 = uVar6;
                    uVar6 = UF::P_[uVar10];
                    uVar4 = *(uint *)(lVar7 + -4 + lVar13 * 4);
                  } while (UF::P_[uVar10] < uVar10);
                  do {
                    uVar6 = uVar4;
                    uVar4 = UF::P_[uVar6];
                  } while (UF::P_[uVar6] < uVar6);
                  if (uVar10 < uVar6) {
                    UF::P_[uVar6] = uVar10;
                  }
                  else {
                    UF::P_[uVar10] = uVar6;
                  }
                }
              }
              else {
                *(undefined4 *)(lVar23 + lVar13 * 4) = *(undefined4 *)(lVar7 + lVar13 * 4);
                iVar12 = 4;
              }
              goto LAB_001a48bd;
            }
            uVar5 = 1;
            if ((uVar20 < uVar11) && (*(char *)(lVar21 + lVar13) != '\0')) {
              UF::P_[UF::length_] = UF::length_;
              uVar6 = UF::length_ + 1;
              *(uint *)(lVar19 + lVar13 * 4) = UF::length_;
              UF::length_ = uVar6;
              uVar5 = 3;
            }
            break;
          case 2:
            if (*(char *)(lVar16 + lVar13) != '\0') {
              uVar5 = 2;
              if (iVar12 == 6) {
                uVar6 = *(uint *)(lVar23 + -4 + lVar13 * 4);
                *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                iVar12 = 6;
                if (((uVar15 != 0) && (lVar13 + 1 < lVar14)) &&
                   (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                  do {
                    uVar10 = uVar6;
                    uVar18 = (ulong)uVar10;
                    uVar6 = UF::P_[uVar18];
                    uVar4 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                  } while (UF::P_[uVar18] < uVar10);
                  do {
                    uVar6 = uVar4;
                    uVar22 = (ulong)uVar6;
                    uVar4 = UF::P_[uVar22];
                  } while (UF::P_[uVar22] < uVar6);
LAB_001a4c6e:
                  if (uVar10 < uVar6) {
                    UF::P_[uVar22] = uVar10;
                  }
                  else {
                    UF::P_[uVar18] = uVar6;
                  }
                  iVar12 = 5;
                }
              }
              else if (iVar12 == 5) {
LAB_001a44fa:
                *(undefined4 *)(lVar23 + lVar13 * 4) = *(undefined4 *)(lVar23 + -4 + lVar13 * 4);
                iVar12 = 5;
                uVar5 = 5;
              }
              else if (iVar12 == 4) {
                uVar6 = *(uint *)(lVar23 + -4 + lVar13 * 4);
                *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                uVar5 = 4;
                iVar12 = 6;
                if (uVar15 != 0) {
                  bVar24 = *(char *)(lVar17 + lVar13) == '\0';
                  if (bVar24) {
                    if ((lVar13 + 1 < lVar14) && (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                      do {
                        uVar10 = uVar6;
                        uVar18 = (ulong)uVar10;
                        uVar6 = UF::P_[uVar18];
                        uVar4 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                      } while (UF::P_[uVar18] < uVar10);
                      do {
                        uVar6 = uVar4;
                        uVar22 = (ulong)uVar6;
                        uVar4 = UF::P_[uVar22];
                      } while (UF::P_[uVar22] < uVar6);
                      goto LAB_001a4c6e;
                    }
                  }
                  else {
LAB_001a44bf:
                    uVar5 = 4;
                    iVar12 = (uint)bVar24 * 2 + 4;
                  }
                }
              }
              goto LAB_001a4c90;
            }
LAB_001a44ce:
            uVar5 = 1;
            if ((uVar20 < uVar11) && (*(char *)(lVar21 + lVar13) != '\0')) {
              *(undefined4 *)(lVar19 + lVar13 * 4) = *(undefined4 *)(lVar23 + -4 + lVar13 * 4);
              goto LAB_001a44f0;
            }
            break;
          case 3:
            if (*(char *)(lVar16 + lVar13) == '\0') goto LAB_001a4443;
            if (uVar15 != 0) {
              if (*(char *)(lVar17 + lVar13) != '\0') {
                uVar6 = *(uint *)(lVar7 + lVar13 * 4);
                *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                do {
                  uVar10 = uVar6;
                  uVar18 = (ulong)uVar10;
                  uVar6 = UF::P_[uVar18];
                  uVar4 = *(uint *)(lVar19 + -4 + lVar13 * 4);
                } while (UF::P_[uVar18] < uVar10);
                do {
                  uVar6 = uVar4;
                  uVar22 = (ulong)uVar6;
                  uVar4 = UF::P_[uVar22];
                } while (UF::P_[uVar22] < uVar6);
LAB_001a4432:
                if (uVar10 < uVar6) {
                  UF::P_[uVar22] = uVar10;
                }
                else {
                  UF::P_[uVar18] = uVar6;
                }
                iVar12 = 4;
                goto LAB_001a4c25;
              }
              if ((lVar13 + 1 < lVar14) && (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                uVar6 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                puVar9 = UF::P_;
                do {
                  uVar10 = uVar6;
                  uVar6 = UF::P_[uVar10];
                  uVar4 = *(uint *)(lVar19 + -4 + lVar13 * 4);
                } while (UF::P_[uVar10] < uVar10);
                do {
                  uVar6 = uVar4;
                  uVar4 = UF::P_[uVar6];
                } while (UF::P_[uVar6] < uVar6);
                uVar4 = uVar6;
                if (uVar10 >= uVar6 && uVar10 != uVar6) {
                  uVar4 = uVar10;
                }
                if (uVar10 < uVar6) {
                  uVar6 = uVar10;
                }
                UF::P_[uVar4] = uVar6;
                iVar12 = 5;
                if ((lVar13 == 0) || (*(char *)(lVar17 + -1 + lVar13) == '\0')) goto LAB_001a4c25;
                uVar6 = *(uint *)(lVar23 + lVar13 * 4);
                do {
                  uVar10 = uVar6;
                  uVar18 = (ulong)uVar10;
                  uVar6 = puVar9[uVar18];
                  uVar4 = *(uint *)(lVar7 + -4 + lVar13 * 4);
                } while (puVar9[uVar18] < uVar10);
                do {
                  uVar6 = uVar4;
                  uVar22 = (ulong)uVar6;
                  uVar4 = puVar9[uVar22];
                } while (puVar9[uVar22] < uVar6);
                goto LAB_001a4c08;
              }
            }
            uVar6 = *(uint *)(lVar19 + -4 + lVar13 * 4);
            *(uint *)(lVar23 + lVar13 * 4) = uVar6;
            iVar12 = 6;
            if ((lVar13 != 0 && uVar15 != 0) && (*(char *)(lVar17 + -1 + lVar13) != '\0')) {
              do {
                uVar10 = uVar6;
                uVar18 = (ulong)uVar10;
                uVar6 = UF::P_[uVar18];
                uVar4 = *(uint *)(lVar7 + -4 + lVar13 * 4);
              } while (UF::P_[uVar18] < uVar10);
              do {
                uVar6 = uVar4;
                uVar22 = (ulong)uVar6;
                puVar9 = UF::P_;
                uVar4 = UF::P_[uVar22];
              } while (UF::P_[uVar22] < uVar6);
LAB_001a4c08:
              if (uVar10 < uVar6) {
                puVar9[uVar22] = uVar10;
              }
              else {
                puVar9[uVar18] = uVar6;
              }
            }
LAB_001a4c25:
            uVar5 = 8;
            goto LAB_001a4c90;
          case 4:
            if (*(char *)(lVar16 + lVar13) == '\0') goto LAB_001a44ce;
            uVar5 = 4;
            if (iVar12 == 6) {
              uVar6 = *(uint *)(lVar23 + -4 + lVar13 * 4);
              *(uint *)(lVar23 + lVar13 * 4) = uVar6;
              iVar12 = 6;
              if (((uVar15 != 0) && (lVar13 + 1 < lVar14)) &&
                 (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                do {
                  uVar10 = uVar6;
                  uVar18 = (ulong)uVar10;
                  uVar6 = UF::P_[uVar18];
                  uVar4 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                } while (UF::P_[uVar18] < uVar10);
                do {
                  uVar6 = uVar4;
                  uVar22 = (ulong)uVar6;
                  uVar4 = UF::P_[uVar22];
                } while (UF::P_[uVar22] < uVar6);
                goto LAB_001a4c6e;
              }
            }
            else {
              if (iVar12 == 5) goto LAB_001a44fa;
              if (iVar12 == 4) {
                uVar6 = *(uint *)(lVar23 + -4 + lVar13 * 4);
                *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                iVar12 = 6;
                if (uVar15 != 0) {
                  bVar24 = *(char *)(lVar17 + lVar13) == '\0';
                  if (!bVar24) goto LAB_001a44bf;
                  if ((lVar13 + 1 < lVar14) && (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                    do {
                      uVar10 = uVar6;
                      uVar18 = (ulong)uVar10;
                      uVar6 = UF::P_[uVar18];
                      uVar4 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                    } while (UF::P_[uVar18] < uVar10);
                    do {
                      uVar6 = uVar4;
                      uVar22 = (ulong)uVar6;
                      uVar4 = UF::P_[uVar22];
                    } while (UF::P_[uVar22] < uVar6);
                    goto LAB_001a4c6e;
                  }
                }
              }
            }
            goto LAB_001a4c90;
          case 5:
            if (*(char *)(lVar16 + lVar13) == '\0') goto LAB_001a44ce;
            uVar6 = *(uint *)(lVar23 + -4 + lVar13 * 4);
            *(uint *)(lVar23 + lVar13 * 4) = uVar6;
            iVar12 = 6;
            if (uVar15 != 0) {
              bVar24 = *(char *)(lVar17 + lVar13) == '\0';
              if (bVar24) {
                if ((lVar13 + 1 < lVar14) && (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                  do {
                    uVar10 = uVar6;
                    uVar6 = UF::P_[uVar10];
                    uVar4 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                  } while (UF::P_[uVar10] < uVar10);
                  do {
                    uVar6 = uVar4;
                    uVar4 = UF::P_[uVar6];
                  } while (UF::P_[uVar6] < uVar6);
                  uVar4 = uVar6;
                  if (uVar10 >= uVar6 && uVar10 != uVar6) {
                    uVar4 = uVar10;
                  }
                  if (uVar10 < uVar6) {
                    uVar6 = uVar10;
                  }
                  UF::P_[uVar4] = uVar6;
                  iVar12 = 5;
                }
              }
              else {
                iVar12 = (uint)bVar24 * 2 + 4;
              }
            }
            uVar5 = 4;
            goto LAB_001a4c90;
          case 6:
            if (*(char *)(lVar16 + lVar13) == '\0') goto LAB_001a44ce;
            if (iVar12 == 6) {
              uVar6 = *(uint *)(lVar23 + -4 + lVar13 * 4);
              *(uint *)(lVar23 + lVar13 * 4) = uVar6;
              uVar5 = 6;
              if (((uVar15 != 0) && (lVar13 + 1 < lVar14)) &&
                 (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                do {
                  uVar10 = uVar6;
                  uVar18 = (ulong)uVar10;
                  uVar6 = UF::P_[uVar18];
                  uVar4 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                } while (UF::P_[uVar18] < uVar10);
                do {
                  uVar6 = uVar4;
                  uVar22 = (ulong)uVar6;
                  uVar4 = UF::P_[uVar22];
                } while (UF::P_[uVar22] < uVar6);
                goto LAB_001a4c6e;
              }
              iVar12 = 6;
            }
            else {
              uVar5 = 6;
              if (iVar12 == 5) goto LAB_001a44fa;
            }
            goto LAB_001a4c90;
          case 7:
            if (*(char *)(lVar16 + lVar13) != '\0') {
              if (uVar15 != 0) {
                if (*(char *)(lVar17 + lVar13) != '\0') {
                  uVar6 = *(uint *)(lVar7 + lVar13 * 4);
                  *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                  do {
                    uVar10 = uVar6;
                    uVar18 = (ulong)uVar10;
                    uVar6 = UF::P_[uVar18];
                    uVar4 = *(uint *)(lVar19 + -4 + lVar13 * 4);
                  } while (UF::P_[uVar18] < uVar10);
                  do {
                    uVar6 = uVar4;
                    uVar22 = (ulong)uVar6;
                    uVar4 = UF::P_[uVar22];
                  } while (UF::P_[uVar22] < uVar6);
                  goto LAB_001a4432;
                }
                if ((lVar13 + 1 < lVar14) && (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                  uVar6 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                  *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                  puVar9 = UF::P_;
                  do {
                    uVar10 = uVar6;
                    uVar6 = UF::P_[uVar10];
                    uVar4 = *(uint *)(lVar19 + -4 + lVar13 * 4);
                  } while (UF::P_[uVar10] < uVar10);
                  do {
                    uVar6 = uVar4;
                    uVar4 = UF::P_[uVar6];
                  } while (UF::P_[uVar6] < uVar6);
                  uVar4 = uVar6;
                  if (uVar10 >= uVar6 && uVar10 != uVar6) {
                    uVar4 = uVar10;
                  }
                  if (uVar10 < uVar6) {
                    uVar6 = uVar10;
                  }
                  UF::P_[uVar4] = uVar6;
                  iVar12 = 5;
                  if ((lVar13 != 0) && (*(char *)(lVar17 + -1 + lVar13) != '\0')) {
                    uVar6 = *(uint *)(lVar23 + lVar13 * 4);
                    do {
                      uVar10 = uVar6;
                      uVar18 = (ulong)uVar10;
                      uVar6 = puVar9[uVar18];
                      uVar4 = *(uint *)(lVar7 + -4 + lVar13 * 4);
                    } while (puVar9[uVar18] < uVar10);
                    do {
                      uVar6 = uVar4;
                      uVar22 = (ulong)uVar6;
                      uVar4 = puVar9[uVar22];
                    } while (puVar9[uVar22] < uVar6);
                    goto LAB_001a4c08;
                  }
                  goto LAB_001a4c25;
                }
              }
              uVar6 = *(uint *)(lVar19 + -4 + lVar13 * 4);
              *(uint *)(lVar23 + lVar13 * 4) = uVar6;
              iVar12 = 6;
              if ((lVar13 != 0 && uVar15 != 0) && (*(char *)(lVar17 + -1 + lVar13) != '\0')) {
                do {
                  uVar10 = uVar6;
                  uVar18 = (ulong)uVar10;
                  uVar6 = UF::P_[uVar18];
                  uVar4 = *(uint *)(lVar7 + -4 + lVar13 * 4);
                } while (UF::P_[uVar18] < uVar10);
                do {
                  uVar6 = uVar4;
                  uVar22 = (ulong)uVar6;
                  puVar9 = UF::P_;
                  uVar4 = UF::P_[uVar22];
                } while (UF::P_[uVar22] < uVar6);
                goto LAB_001a4c08;
              }
              goto LAB_001a4c25;
            }
            goto LAB_001a4443;
          case 8:
            if (*(char *)(lVar16 + lVar13) == '\0') goto LAB_001a44ce;
            uVar5 = 8;
            if (iVar12 == 6) {
              uVar6 = *(uint *)(lVar23 + -4 + lVar13 * 4);
              *(uint *)(lVar23 + lVar13 * 4) = uVar6;
              iVar12 = 6;
              if (((uVar15 != 0) && (lVar13 + 1 < lVar14)) &&
                 (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                do {
                  uVar10 = uVar6;
                  uVar18 = (ulong)uVar10;
                  uVar6 = UF::P_[uVar18];
                  uVar4 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                } while (UF::P_[uVar18] < uVar10);
                do {
                  uVar6 = uVar4;
                  uVar22 = (ulong)uVar6;
                  uVar4 = UF::P_[uVar22];
                } while (UF::P_[uVar22] < uVar6);
                goto LAB_001a4c6e;
              }
            }
            else {
              if (iVar12 == 5) goto LAB_001a44fa;
              if (iVar12 == 4) {
                uVar6 = *(uint *)(lVar23 + -4 + lVar13 * 4);
                *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                uVar5 = 4;
                iVar12 = 6;
                if (uVar15 != 0) {
                  bVar24 = *(char *)(lVar17 + lVar13) == '\0';
                  if (!bVar24) goto LAB_001a44bf;
                  if ((lVar13 + 1 < lVar14) && (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                    do {
                      uVar10 = uVar6;
                      uVar18 = (ulong)uVar10;
                      uVar6 = UF::P_[uVar18];
                      uVar4 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                    } while (UF::P_[uVar18] < uVar10);
                    do {
                      uVar6 = uVar4;
                      uVar22 = (ulong)uVar6;
                      uVar4 = UF::P_[uVar22];
                    } while (UF::P_[uVar22] < uVar6);
                    goto LAB_001a4c6e;
                  }
                }
              }
            }
LAB_001a4c90:
            if ((uVar20 < uVar11) && (*(char *)(lVar21 + lVar13) != '\0')) {
              *(undefined4 *)(lVar19 + lVar13 * 4) = *(undefined4 *)(lVar23 + lVar13 * 4);
            }
            break;
          case 9:
            if (*(char *)(lVar16 + lVar13) != '\0') {
              if (uVar15 != 0) {
                if (*(char *)(lVar17 + lVar13) != '\0') {
                  uVar6 = *(uint *)(lVar7 + lVar13 * 4);
                  *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                  do {
                    uVar10 = uVar6;
                    uVar18 = (ulong)uVar10;
                    uVar6 = UF::P_[uVar18];
                    uVar4 = *(uint *)(lVar19 + -4 + lVar13 * 4);
                  } while (UF::P_[uVar18] < uVar10);
                  do {
                    uVar6 = uVar4;
                    uVar22 = (ulong)uVar6;
                    uVar4 = UF::P_[uVar22];
                  } while (UF::P_[uVar22] < uVar6);
                  goto LAB_001a4432;
                }
                if ((lVar13 + 1 < lVar14) && (*(char *)(lVar17 + lVar13 + 1) != '\0')) {
                  uVar6 = *(uint *)(lVar7 + 4 + lVar13 * 4);
                  *(uint *)(lVar23 + lVar13 * 4) = uVar6;
                  puVar9 = UF::P_;
                  do {
                    uVar10 = uVar6;
                    uVar6 = UF::P_[uVar10];
                    uVar4 = *(uint *)(lVar19 + -4 + lVar13 * 4);
                  } while (UF::P_[uVar10] < uVar10);
                  do {
                    uVar6 = uVar4;
                    uVar4 = UF::P_[uVar6];
                  } while (UF::P_[uVar6] < uVar6);
                  uVar4 = uVar6;
                  if (uVar10 >= uVar6 && uVar10 != uVar6) {
                    uVar4 = uVar10;
                  }
                  if (uVar10 < uVar6) {
                    uVar6 = uVar10;
                  }
                  UF::P_[uVar4] = uVar6;
                  iVar12 = 5;
                  if ((lVar13 != 0) && (*(char *)(lVar17 + -1 + lVar13) != '\0')) {
                    uVar6 = *(uint *)(lVar23 + lVar13 * 4);
                    do {
                      uVar10 = uVar6;
                      uVar18 = (ulong)uVar10;
                      uVar6 = puVar9[uVar18];
                      uVar4 = *(uint *)(lVar7 + -4 + lVar13 * 4);
                    } while (puVar9[uVar18] < uVar10);
                    do {
                      uVar6 = uVar4;
                      uVar22 = (ulong)uVar6;
                      uVar4 = puVar9[uVar22];
                    } while (puVar9[uVar22] < uVar6);
                    goto LAB_001a4c08;
                  }
                  goto LAB_001a4c25;
                }
              }
              lVar8 = lVar13 + -1;
              uVar6 = *(uint *)(lVar19 + lVar8 * 4);
              *(uint *)(lVar23 + lVar13 * 4) = uVar6;
              iVar12 = 6;
              if ((lVar13 != 0 && uVar15 != 0) && (*(char *)(lVar17 + lVar8) != '\0')) {
                do {
                  uVar10 = uVar6;
                  uVar18 = (ulong)uVar10;
                  uVar6 = UF::P_[uVar18];
                  uVar4 = *(uint *)(lVar7 + lVar8 * 4);
                } while (UF::P_[uVar18] < uVar10);
                do {
                  uVar6 = uVar4;
                  uVar22 = (ulong)uVar6;
                  puVar9 = UF::P_;
                  uVar4 = UF::P_[uVar22];
                } while (UF::P_[uVar22] < uVar6);
                goto LAB_001a4c08;
              }
              goto LAB_001a4c25;
            }
LAB_001a4443:
            uVar5 = 1;
            if ((uVar20 < uVar11) && (*(char *)(lVar21 + lVar13) != '\0')) {
              *(undefined4 *)(lVar19 + lVar13 * 4) = *(undefined4 *)(lVar19 + -4 + lVar13 * 4);
              uVar5 = 9;
            }
            break;
          case 0xffffffff:
            if (*(char *)(lVar16 + lVar13) != '\0') {
              if (uVar15 == 0) {
LAB_001a47c3:
                UF::P_[UF::length_] = UF::length_;
                iVar12 = 6;
                uVar6 = UF::length_;
                UF::length_ = UF::length_ + 1;
              }
              else if (*(char *)(lVar17 + lVar13) == '\0') {
                if ((lVar14 <= lVar13 + 1) || (*(char *)(lVar17 + lVar13 + 1) == '\0'))
                goto LAB_001a47c3;
                iVar12 = 5;
                uVar6 = *(uint *)(lVar7 + 4 + lVar13 * 4);
              }
              else {
                iVar12 = 4;
                uVar6 = *(uint *)(lVar7 + lVar13 * 4);
              }
              *(uint *)(lVar23 + lVar13 * 4) = uVar6;
LAB_001a48bd:
              uVar5 = 2;
              goto LAB_001a4c90;
            }
            uVar5 = 1;
            if ((uVar11 <= uVar20) || (*(char *)(lVar21 + lVar13) == '\0')) break;
            UF::P_[UF::length_] = UF::length_;
            uVar6 = UF::length_ + 1;
            *(uint *)(lVar19 + lVar13 * 4) = UF::length_;
            UF::length_ = uVar6;
LAB_001a44f0:
            uVar5 = 7;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar14);
      }
      uVar15 = uVar15 + 2;
    } while (uVar15 < uVar11);
  }
  return;
}

Assistant:

void FirstScan() 
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5
    }